

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndividualBeliefJESP.cpp
# Opt level: O0

void __thiscall
IndividualBeliefJESP::IndividualBeliefJESP
          (IndividualBeliefJESP *this,Index agentI,Index stage,PlanningUnitMADPDiscrete *pu)

{
  _func_int **pp_Var1;
  vector<double,_std::allocator<double>_> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrElems;
  _func_int **in_RCX;
  undefined4 in_EDX;
  uint in_ESI;
  BeliefInterface *in_RDI;
  size_t size;
  size_t nrOH_j;
  Index j;
  size_t nrJOH_others;
  size_t nrS;
  Index in_stack_ffffffffffffff28;
  Index in_stack_ffffffffffffff2c;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffff30;
  StateDistributionVector *in_stack_ffffffffffffff38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff40;
  undefined1 *__n;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  void **in_stack_ffffffffffffff58;
  Belief *in_stack_ffffffffffffff60;
  undefined1 local_71;
  undefined8 local_70;
  vector<double,_std::allocator<double>_> *local_50;
  vector<double,_std::allocator<double>_> *local_48;
  uint local_3c;
  long local_38;
  size_t local_30;
  _func_int **local_18;
  undefined4 local_10;
  uint local_c;
  
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  BeliefInterface::BeliefInterface(in_RDI);
  ::Belief::Belief(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   (size_t)in_stack_ffffffffffffff50);
  in_RDI->_vptr_BeliefInterface = (_func_int **)&PTR__IndividualBeliefJESP_00d32790;
  in_RDI->_vptr_BeliefInterface = (_func_int **)&PTR__IndividualBeliefJESP_00d32790;
  in_RDI[5]._vptr_BeliefInterface = local_18;
  *(undefined4 *)&in_RDI[6]._vptr_BeliefInterface = local_10;
  *(uint *)&in_RDI[8]._vptr_BeliefInterface = local_c;
  Scope::Scope((Scope *)in_stack_ffffffffffffff30);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x9c644d);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x9c6460);
  local_30 = PlanningUnitMADPDiscrete::GetNrStates(in_stack_ffffffffffffff30);
  pp_Var1 = (_func_int **)(**(code **)(*in_RDI[5]._vptr_BeliefInterface + 0x30))();
  in_RDI[7]._vptr_BeliefInterface = pp_Var1;
  local_38 = 1;
  for (local_3c = 0; (_func_int **)(ulong)local_3c < in_RDI[7]._vptr_BeliefInterface;
      local_3c = local_3c + 1) {
    if (local_3c != local_c) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (in_stack_ffffffffffffff40,(value_type_conflict1 *)in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff50 =
           (vector<double,_std::allocator<double>_> *)
           PlanningUnitMADPDiscrete::GetNrObservationHistories
                     (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
      ;
      local_38 = local_38 * (long)in_stack_ffffffffffffff50;
      local_48 = in_stack_ffffffffffffff50;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff40,
                 (value_type_conflict2 *)in_stack_ffffffffffffff38);
    }
  }
  this_00 = (vector<double,_std::allocator<double>_> *)(local_30 * local_38);
  local_70 = 0;
  __n = &local_71;
  local_50 = this_00;
  std::allocator<double>::allocator((allocator<double> *)0x9c660b);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff50,(size_type)__n,(value_type_conflict3 *)this_00,
             (allocator_type *)in_stack_ffffffffffffff38);
  StateDistributionVector::operator=(in_stack_ffffffffffffff38,(SDV *)in_stack_ffffffffffffff30);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::allocator<double>::~allocator((allocator<double> *)0x9c664f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
             (value_type_conflict2 *)in_stack_ffffffffffffff38);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
             (value_type_conflict2 *)in_stack_ffffffffffffff38);
  nrElems = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            IndexTools::CalculateStepSize
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_ffffffffffffff38);
  in_RDI[0x12]._vptr_BeliefInterface = (_func_int **)nrElems;
  pp_Var1 = (_func_int **)IndexTools::CalculateStepSize(nrElems);
  in_RDI[0x13]._vptr_BeliefInterface = pp_Var1;
  return;
}

Assistant:

IndividualBeliefJESP::IndividualBeliefJESP(Index agentI, Index stage,
    const PlanningUnitMADPDiscrete& pu) 
    :
    Belief(0),
    _m_pumadp(&pu),
    _m_stage(stage),
    _m_agentI(agentI)
{
    //compute size of  this belief:
    size_t nrS = _m_pumadp->GetNrStates();
    _m_nrAgents= _m_pumadp->GetNrAgents();
    size_t nrJOH_others = 1;
    for(Index j=0; j < _m_nrAgents; j++)
    {
        if(j == agentI)
            continue;
        //else:
        _m_others.push_back(j);
        size_t nrOH_j = _m_pumadp->GetNrObservationHistories(j, stage);
        nrJOH_others *=  nrOH_j;
        _m_nrOH_others.push_back(nrOH_j);
    }
    size_t size = nrS * nrJOH_others;
    _m_b = vector<double>(size,0.0);
    _m_sizeVec.push_back(nrS);
    _m_sizeVec.push_back(nrJOH_others);
    _m_stepsizeSJOH = IndexTools::CalculateStepSize(_m_sizeVec);

    //we will use 
    // IndexTools::JointToIndividualIndicesStepSize(Index jointI, 
    //      const vector<size_t> &step_size, size_t vec_size )
    //and
    // IndexTools::IndividualToJointIndicesStepSize (const std::vector< Index >
    //      &indices, const std::vector< size_t > &step_size)
    //
    // to do the conversions between JOHI_j <-> <OHI_1,...,OHI_nrA >
    //
    // so we cah the step_size
    _m_stepsizeJOHOH = IndexTools::CalculateStepSize(_m_nrOH_others);
}